

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_logger_impl.h
# Opt level: O3

void __thiscall spdlog::async_logger::_sink_it(async_logger *this,log_msg *msg)

{
  async_log_helper *this_00;
  async_msg local_80;
  
  this_00 = (this->_async_log_helper)._M_t.
            super___uniq_ptr_impl<spdlog::details::async_log_helper,_std::default_delete<spdlog::details::async_log_helper>_>
            ._M_t.
            super__Tuple_impl<0UL,_spdlog::details::async_log_helper_*,_std::default_delete<spdlog::details::async_log_helper>_>
            .super__Head_base<0UL,_spdlog::details::async_log_helper_*,_false>._M_head_impl;
  details::async_log_helper::async_msg::async_msg(&local_80,msg);
  details::async_log_helper::push_msg(this_00,&local_80);
  details::async_log_helper::async_msg::~async_msg(&local_80);
  if (msg->level != off &&
      (this->super_logger)._flush_level.super___atomic_base<int>._M_i <= (int)msg->level) {
    local_80.logger_name._M_dataplus._M_p = (pointer)&local_80.logger_name.field_2;
    local_80.logger_name._M_string_length = 0;
    local_80.logger_name.field_2._M_local_buf[0] = '\0';
    local_80.level = info;
    local_80.txt._M_dataplus._M_p = (pointer)&local_80.txt.field_2;
    local_80.time.__d.__r = (duration)0;
    local_80.thread_id = 0;
    local_80.txt._M_string_length = 0;
    local_80.txt.field_2._M_local_buf[0] = '\0';
    local_80.msg_type = flush;
    local_80.msg_id = 0;
    details::async_log_helper::push_msg
              ((this->_async_log_helper)._M_t.
               super___uniq_ptr_impl<spdlog::details::async_log_helper,_std::default_delete<spdlog::details::async_log_helper>_>
               ._M_t.
               super__Tuple_impl<0UL,_spdlog::details::async_log_helper_*,_std::default_delete<spdlog::details::async_log_helper>_>
               .super__Head_base<0UL,_spdlog::details::async_log_helper_*,_false>._M_head_impl,
               &local_80);
    details::async_log_helper::async_msg::~async_msg(&local_80);
  }
  return;
}

Assistant:

inline void spdlog::async_logger::_sink_it(details::log_msg &msg)
{
    try
    {
#if defined(SPDLOG_ENABLE_MESSAGE_COUNTER)
        _incr_msg_counter(msg);
#endif
        _async_log_helper->log(msg);
        if (_should_flush_on(msg))
        {
            _async_log_helper->flush(false); // do async flush
        }
    }
    catch (const std::exception &ex)
    {
        _err_handler(ex.what());
    }
    catch (...)
    {
        _err_handler("Unknown exception in logger " + _name);
        throw;
    }
}